

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetMetricGroupCreateExp
          (zet_device_handle_t hDevice,char *pName,char *pDescription,
          zet_metric_group_sampling_type_flags_t samplingType,
          zet_metric_group_handle_t *phMetricGroup)

{
  object_t<_zet_metric_group_handle_t_*> *poVar1;
  bad_alloc *anon_var_0;
  zet_pfnMetricGroupCreateExp_t pfnCreateExp;
  dditable_t *dditable;
  zet_metric_group_handle_t *pp_Stack_38;
  ze_result_t result;
  zet_metric_group_handle_t *phMetricGroup_local;
  char *pcStack_28;
  zet_metric_group_sampling_type_flags_t samplingType_local;
  char *pDescription_local;
  char *pName_local;
  zet_device_handle_t hDevice_local;
  
  dditable._4_4_ = 0;
  pfnCreateExp = *(zet_pfnMetricGroupCreateExp_t *)(hDevice + 8);
  if (*(code **)(pfnCreateExp + 0x788) == (code *)0x0) {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pName_local = *(char **)hDevice;
    pp_Stack_38 = phMetricGroup;
    phMetricGroup_local._4_4_ = samplingType;
    pcStack_28 = pDescription;
    pDescription_local = pName;
    dditable._4_4_ =
         (**(code **)(pfnCreateExp + 0x788))
                   (pName_local,pName,pDescription,samplingType,phMetricGroup);
    hDevice_local._4_4_ = dditable._4_4_;
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar1 = singleton_factory_t<object_t<_zet_metric_group_handle_t*>,_zet_metric_group_handle_t*>
               ::getInstance<_zet_metric_group_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_zet_metric_group_handle_t*>,_zet_metric_group_handle_t*>
                           *)(context + 0x1200),pp_Stack_38,(dditable_t **)&pfnCreateExp);
      *pp_Stack_38 = (zet_metric_group_handle_t)poVar1;
      hDevice_local._4_4_ = dditable._4_4_;
    }
  }
  return hDevice_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupCreateExp(
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        const char* pName,                              ///< [in] pointer to metric group name. Must point to a null-terminated
                                                        ///< character array no longer than ::ZET_MAX_METRIC_GROUP_NAME.
        const char* pDescription,                       ///< [in] pointer to metric group description. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_GROUP_DESCRIPTION.
        zet_metric_group_sampling_type_flags_t samplingType,///< [in] Sampling type for the metric group.
        zet_metric_group_handle_t* phMetricGroup        ///< [in,out] Created Metric group handle
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_device_object_t*>( hDevice )->dditable;
        auto pfnCreateExp = dditable->zet.MetricGroupExp.pfnCreateExp;
        if( nullptr == pfnCreateExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zet_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnCreateExp( hDevice, pName, pDescription, samplingType, phMetricGroup );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phMetricGroup = reinterpret_cast<zet_metric_group_handle_t>(
                context->zet_metric_group_factory.getInstance( *phMetricGroup, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }